

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O2

void __thiscall
CppGenerator::createRelationSortingOrder(CppGenerator *this,TDNode *node,size_t *parent_id)

{
  size_t relationID;
  size_t **ppsVar1;
  TDNode *node_00;
  size_t var;
  ulong uVar2;
  size_t neigh;
  ulong uVar3;
  long lVar4;
  var_bitset additionalVars;
  var_bitset interaction;
  _Base_bitset<2UL> local_60;
  _Base_bitset<2UL> local_50;
  _Base_bitset<2UL> local_40;
  
  for (uVar3 = 0; uVar3 < node->_numOfNeighbors; uVar3 = uVar3 + 1) {
    relationID = (node->_neighbors).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar3];
    if (relationID != *parent_id) {
      node_00 = TreeDecomposition::getRelation
                          ((this->_td).
                           super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           relationID);
      local_40._M_w = (_WordT  [2])std::operator&(&node->_bag,&node_00->_bag);
      ppsVar1 = this->sortOrders;
      lVar4 = 0;
      for (uVar2 = 0; uVar2 != 100; uVar2 = uVar2 + 1) {
        if ((local_40._M_w[uVar2 >> 6] >> (uVar2 & 0x3f) & 1) != 0) {
          ppsVar1[node_00->_id][lVar4] = uVar2;
          lVar4 = lVar4 + 1;
        }
      }
      local_60._M_w = (_WordT  [2])std::bitset<100UL>::operator~(&node->_bag);
      local_50._M_w = (_WordT  [2])std::operator&((bitset<100UL> *)&local_60,&node_00->_bag);
      ppsVar1 = this->sortOrders;
      for (uVar2 = 0; uVar2 != 100; uVar2 = uVar2 + 1) {
        if ((local_50._M_w[uVar2 >> 6] >> (uVar2 & 0x3f) & 1) != 0) {
          ppsVar1[node_00->_id][lVar4] = uVar2;
          lVar4 = lVar4 + 1;
        }
      }
      createRelationSortingOrder(this,node_00,&node->_id);
    }
  }
  return;
}

Assistant:

void CppGenerator::createRelationSortingOrder(TDNode* node, const size_t& parent_id)
{
    // get intersection with parent Node node
    for (size_t neigh = 0; neigh < node->_numOfNeighbors; ++neigh)
    {
        if (node->_neighbors[neigh] != parent_id)
        {
            TDNode* neighbor = _td->getRelation(node->_neighbors[neigh]);
            const size_t& neighID = neighbor->_id;
            
            var_bitset interaction = node->_bag & neighbor->_bag;
            
            size_t orderIdx = 0;
            for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
            {
                if (interaction[var])
                {
                    // add to sort order
                    sortOrders[neighID][orderIdx] = var;
                    ++orderIdx;
                }
            }

            var_bitset additionalVars =  ~node->_bag & neighbor->_bag;
            for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
            {
                if (additionalVars[var])
                {
                    // add to sort order
                    sortOrders[neighID][orderIdx] = var;
                    ++orderIdx;
                }
            } 
            createRelationSortingOrder(neighbor, node->_id);
        }
    }
}